

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_simulation_helpers.hpp
# Opt level: O1

RateAdaptiveCode<unsigned_int> * __thiscall
LDPC4QKD::CodeSimulationHelpers::load_ldpc<bool,unsigned_int,unsigned_int>
          (RateAdaptiveCode<unsigned_int> *__return_storage_ptr__,CodeSimulationHelpers *this,
          string *file_path,string *rate_adaption_file_path)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  runtime_error *this_00;
  string *psVar3;
  undefined1 auVar4 [16];
  path filePath;
  path local_a8;
  path local_80;
  path local_58;
  
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             auto_format);
  auVar4 = std::filesystem::__cxx11::path::_M_find_extension();
  pbVar2 = auVar4._0_8_;
  psVar3 = (string *)
           CONCAT71((int7)((ulong)rate_adaption_file_path >> 8),
                    pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0);
  if (auVar4._8_8_ == 0xffffffffffffffff ||
      pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::filesystem::__cxx11::path::path(&local_80);
  }
  else {
    psVar3 = (string *)0xffffffffffffffff;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_a8._M_pathname,pbVar2,auVar4._8_8_,0xffffffffffffffff);
    std::filesystem::__cxx11::path::path(&local_80,&local_a8._M_pathname,auto_format);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_pathname._M_dataplus._M_p != &local_a8._M_pathname.field_2) {
      operator_delete(local_a8._M_pathname._M_dataplus._M_p,
                      local_a8._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  std::filesystem::__cxx11::path::path<char[8],std::filesystem::__cxx11::path>
            (&local_a8,(char (*) [8])".cscmat",auto_format);
  iVar1 = std::filesystem::__cxx11::path::compare(&local_80);
  std::filesystem::__cxx11::path::~path(&local_a8);
  std::filesystem::__cxx11::path::~path(&local_80);
  if (iVar1 == 0) {
    load_ldpc_from_cscmat<bool,unsigned_int>(__return_storage_ptr__,this,file_path,psVar3);
  }
  else {
    auVar4 = std::filesystem::__cxx11::path::_M_find_extension();
    pbVar2 = auVar4._0_8_;
    psVar3 = (string *)
             CONCAT71((int7)((ulong)psVar3 >> 8),
                      pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0);
    if (auVar4._8_8_ == 0xffffffffffffffff ||
        pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::filesystem::__cxx11::path::path(&local_80);
    }
    else {
      psVar3 = (string *)0xffffffffffffffff;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_a8._M_pathname,pbVar2,auVar4._8_8_,0xffffffffffffffff);
      std::filesystem::__cxx11::path::path(&local_80,&local_a8._M_pathname,auto_format);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_pathname._M_dataplus._M_p != &local_a8._M_pathname.field_2) {
        operator_delete(local_a8._M_pathname._M_dataplus._M_p,
                        local_a8._M_pathname.field_2._M_allocated_capacity + 1);
      }
    }
    std::filesystem::__cxx11::path::path<char[6],std::filesystem::__cxx11::path>
              (&local_a8,(char (*) [6])0x11be4c,auto_format);
    iVar1 = std::filesystem::__cxx11::path::compare(&local_80);
    std::filesystem::__cxx11::path::~path(&local_a8);
    std::filesystem::__cxx11::path::~path(&local_80);
    if (iVar1 != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Expected file with extension .cscmat or .json");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    load_ldpc_from_json<bool,unsigned_int,unsigned_int>
              (__return_storage_ptr__,this,file_path,psVar3);
  }
  std::filesystem::__cxx11::path::~path(&local_58);
  return __return_storage_ptr__;
}

Assistant:

LDPC4QKD::RateAdaptiveCode<idx_t> load_ldpc(
            const std::string &file_path, const std::string &rate_adaption_file_path=""
    ) {
        std::filesystem::path filePath = file_path;
        if (filePath.extension() == ".cscmat") {
            return load_ldpc_from_cscmat(file_path, rate_adaption_file_path);
        } else if (filePath.extension() == ".json") {
            return load_ldpc_from_json(file_path, rate_adaption_file_path);
        } else {
            throw std::runtime_error("Expected file with extension .cscmat or .json");
        }
    }